

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

PLYValue * gvr::anon_unknown_3::createValue(ply_type type,ply_encoding encoding)

{
  bool bVar1;
  PLYValue *pPVar2;
  undefined **ppuVar3;
  
  if (encoding != ply_little_endian) {
    if (encoding != ply_big_endian) {
      if (encoding != ply_ascii) {
        return (PLYValue *)0x0;
      }
      if (ply_float64 < type) {
        return (PLYValue *)0x0;
      }
      if ((0x2aU >> (type & 0x1f) & 1) != 0) {
        pPVar2 = (PLYValue *)operator_new(0x10);
        ppuVar3 = &PTR__PLYValue_001775a0;
        goto LAB_0011e914;
      }
      if ((0x54U >> (type & 0x1f) & 1) != 0) {
        pPVar2 = (PLYValue *)operator_new(0x10);
        ppuVar3 = &PTR__PLYValue_00177630;
        goto LAB_0011e914;
      }
      if ((0x180U >> (type & 0x1f) & 1) == 0) {
        return (PLYValue *)0x0;
      }
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_001776c0;
      goto LAB_0011e8a7;
    }
    switch(type) {
    case ply_int8:
      goto switchD_0011e75c_caseD_1;
    case ply_uint8:
      goto switchD_0011e75c_caseD_2;
    case ply_int16:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00177870;
      break;
    case ply_uint16:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00177900;
      break;
    case ply_int32:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00177990;
      goto LAB_0011e914;
    case ply_uint32:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00177a20;
      goto LAB_0011e914;
    case ply_float32:
      bVar1 = gutil::isMSBFirst();
      pPVar2 = (PLYValue *)operator_new(0x10);
      if (bVar1) goto LAB_0011e8dc;
      goto LAB_0011e90d;
    case ply_float64:
      bVar1 = gutil::isMSBFirst();
      pPVar2 = (PLYValue *)operator_new(0x10);
      if (bVar1) goto LAB_0011e863;
      goto LAB_0011e8a0;
    default:
      goto LAB_0011e91e;
    }
    goto LAB_0011e87d;
  }
  switch(type) {
  case ply_int8:
switchD_0011e75c_caseD_1:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00177750;
LAB_0011e7f0:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    *(undefined1 *)&pPVar2[1]._vptr_PLYValue = 0;
    return pPVar2;
  case ply_uint8:
switchD_0011e75c_caseD_2:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_001777e0;
    goto LAB_0011e7f0;
  case ply_int16:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00177cf0;
    goto LAB_0011e87d;
  case ply_uint16:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00177d80;
LAB_0011e87d:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    *(undefined2 *)&pPVar2[1]._vptr_PLYValue = 0;
    return pPVar2;
  case ply_int32:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00177e10;
    break;
  case ply_uint32:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00177ea0;
    break;
  case ply_float32:
    bVar1 = gutil::isMSBFirst();
    pPVar2 = (PLYValue *)operator_new(0x10);
    if (!bVar1) {
LAB_0011e8dc:
      ppuVar3 = &PTR__PLYValue_00177ab0;
      break;
    }
LAB_0011e90d:
    ppuVar3 = &PTR__PLYValue_00177b40;
    break;
  case ply_float64:
    bVar1 = gutil::isMSBFirst();
    pPVar2 = (PLYValue *)operator_new(0x10);
    if (!bVar1) {
LAB_0011e863:
      ppuVar3 = &PTR__PLYValue_00177bd0;
      goto LAB_0011e8a7;
    }
LAB_0011e8a0:
    ppuVar3 = &PTR__PLYValue_00177c60;
LAB_0011e8a7:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    pPVar2[1]._vptr_PLYValue = (_func_int **)0x0;
    return pPVar2;
  default:
LAB_0011e91e:
    return (PLYValue *)0x0;
  }
LAB_0011e914:
  pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
  *(undefined4 *)&pPVar2[1]._vptr_PLYValue = 0;
  return pPVar2;
}

Assistant:

PLYValue *createValue(ply_type type, ply_encoding encoding)
{
  if (encoding == ply_ascii)
  {
    switch (type)
    {
      case ply_int8:
      case ply_int16:
      case ply_int32:
        return new PLYValueASCIIInt();

      case ply_uint8:
      case ply_uint16:
      case ply_uint32:
        return new PLYValueASCIIUInt();

      case ply_float32:
      case ply_float64:
        return new PLYValueASCIIDouble();

      default:
        break;
    }
  }
  else if (encoding == ply_big_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueBigInt16();

      case ply_uint16:
        return new PLYValueBigUInt16();

      case ply_int32:
        return new PLYValueBigInt32();

      case ply_uint32:
        return new PLYValueBigUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat32();
        }
        else
        {
          return new PLYValueSwapFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat64();
        }
        else
        {
          return new PLYValueSwapFloat64();
        }

      default:
        break;
    }
  }
  else if (encoding == ply_little_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueLittleInt16();

      case ply_uint16:
        return new PLYValueLittleUInt16();

      case ply_int32:
        return new PLYValueLittleInt32();

      case ply_uint32:
        return new PLYValueLittleUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat32();
        }
        else
        {
          return new PLYValueFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat64();
        }
        else
        {
          return new PLYValueFloat64();
        }

      default:
        break;
    }
  }

  assert(false);

  return 0;
}